

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void * __thiscall ObjectBlockPool<32,_2048>::Alloc(ObjectBlockPool<32,_2048> *this)

{
  LargeBlock<32,_2048> *pLVar1;
  LargeBlock<32,_2048> *pLVar2;
  uint uVar3;
  LargeBlock<32,_2048> **ppLVar4;
  bool bVar5;
  MyLargeBlock *tmp;
  MyLargeBlock *pMStack_20;
  int index;
  MyLargeBlock *newPage;
  MySmallBlock *result;
  ObjectBlockPool<32,_2048> *this_local;
  
  if ((this->freeBlocks == (MySmallBlock *)0x0) || (this->freeBlocks == &this->lastBlock)) {
    if (this->lastNum == 0x800) {
      result = &this->lastBlock;
      pMStack_20 = (MyLargeBlock *)NULLC::alignedAlloc(0x10010);
      memset(pMStack_20,0,0x10010);
      pMStack_20->next = this->activePages;
      this->activePages = pMStack_20;
      this->lastNum = 0;
      FastVector<LargeBlock<32,_2048>_*,_false,_false>::push_back
                (&this->sortedPages,&stack0xffffffffffffffe0);
      uVar3 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::size(&this->sortedPages);
      while( true ) {
        tmp._4_4_ = uVar3 - 1;
        bVar5 = false;
        if (0 < (int)tmp._4_4_) {
          ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                              (&this->sortedPages,tmp._4_4_);
          pLVar1 = *ppLVar4;
          ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                              (&this->sortedPages,uVar3 - 2);
          bVar5 = pLVar1 < *ppLVar4;
        }
        if (!bVar5) break;
        ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                            (&this->sortedPages,tmp._4_4_);
        pLVar1 = *ppLVar4;
        ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                            (&this->sortedPages,uVar3 - 2);
        pLVar2 = *ppLVar4;
        ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                            (&this->sortedPages,tmp._4_4_);
        *ppLVar4 = pLVar2;
        ppLVar4 = FastVector<LargeBlock<32,_2048>_*,_false,_false>::operator[]
                            (&this->sortedPages,uVar3 - 2);
        *ppLVar4 = pLVar1;
        uVar3 = tmp._4_4_;
      }
    }
    uVar3 = this->lastNum;
    this->lastNum = uVar3 + 1;
    newPage = (MyLargeBlock *)(this->activePages->page + uVar3);
  }
  else {
    newPage = (MyLargeBlock *)this->freeBlocks;
    this->freeBlocks =
         (MySmallBlock *)(this->freeBlocks->marker & (NULLC::OBJECT_MASK ^ 0xffffffffffffffff));
  }
  return newPage;
}

Assistant:

void* Alloc()
	{
		MySmallBlock*	result;
		if(freeBlocks && freeBlocks != &lastBlock)
		{
			result = freeBlocks;
			freeBlocks = (MySmallBlock*)((intptr_t)freeBlocks->next & ~NULLC::OBJECT_MASK);
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock* newPage = new(NULLC::alignedAlloc(sizeof(MyLargeBlock))) MyLargeBlock;
				memset(newPage, 0, sizeof(MyLargeBlock));
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
				sortedPages.push_back(newPage);
				int index = sortedPages.size() - 1;
				while(index > 0 && sortedPages[index] < sortedPages[index - 1])
				{
					MyLargeBlock *tmp = sortedPages[index];
					sortedPages[index] = sortedPages[index - 1];
					sortedPages[index - 1] = tmp;
					index--;
				}
			}
			result = &activePages->page[lastNum++];
		}
		return result;
	}